

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::computeMLResidual(MLMG *this,int amrlevmax)

{
  long *plVar1;
  Any *pAVar2;
  Any *pAVar3;
  Any *pAVar4;
  Any *pAVar5;
  int in_ESI;
  long in_RDI;
  Any *crse_bcdata;
  int alev;
  int mglev;
  Any *in_stack_ffffffffffffff68;
  Any *i;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_ffffffffffffff70;
  undefined8 local_30;
  undefined4 local_14;
  
  for (local_14 = in_ESI; -1 < local_14; local_14 = local_14 + -1) {
    if (local_14 < 1) {
      local_30 = (Any *)0x0;
      i = in_stack_ffffffffffffff68;
    }
    else {
      local_30 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      i = in_stack_ffffffffffffff68;
    }
    plVar1 = *(long **)(in_RDI + 0x48);
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_ffffffffffffff70,(size_type)i);
    pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       (in_stack_ffffffffffffff70,(size_type)i);
    pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       (in_stack_ffffffffffffff70,(size_type)i);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       (in_stack_ffffffffffffff70,(size_type)i);
    (**(code **)(*plVar1 + 0x1a0))(plVar1,local_14,pAVar2,pAVar3,pAVar4,local_30);
    in_stack_ffffffffffffff68 = i;
    if (local_14 < *(int *)(in_RDI + 0x54)) {
      plVar1 = *(long **)(in_RDI + 0x48);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_ffffffffffffff70,(size_type)i);
      pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)i);
      pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)i);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)i);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_ffffffffffffff70,(size_type)i);
      pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)i);
      in_stack_ffffffffffffff68 =
           Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,(size_type)i);
      in_stack_ffffffffffffff70 =
           (Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
           Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,(size_type)i);
      (**(code **)(*plVar1 + 0x1b0))(plVar1,local_14,pAVar2,pAVar3,pAVar4,pAVar5);
    }
  }
  return;
}

Assistant:

void
MLMG::computeMLResidual (int amrlevmax)
{
    BL_PROFILE("MLMG::computeMLResidual()");

    const int mglev = 0;
    for (int alev = amrlevmax; alev >= 0; --alev) {
        const Any* crse_bcdata = (alev > 0) ? &(sol[alev-1]) : nullptr;
        linop.AnySolutionResidual(alev, res[alev][mglev], sol[alev], rhs[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.AnyReflux(alev, res[alev][mglev], sol[alev], rhs[alev],
                            res[alev+1][mglev], sol[alev+1], rhs[alev+1]);
        }
    }
}